

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O0

double __thiscall
imrt::EvaluationFunction::get_delta_eval
          (EvaluationFunction *this,
          list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff,double angle,
          vector<double,_std::allocator<double>_> *w,vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,int n_voxels)

{
  bool bVar1;
  reference ppVar2;
  reference ppVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  const_reference pvVar7;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  int in_R9D;
  double dVar8;
  double dVar9;
  double dVar10;
  __type_conflict _Var11;
  double pen;
  pair<int,_double> let;
  iterator __end2;
  iterator __begin2;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *__range2;
  Matrix *Dep;
  int k;
  int o;
  pair<double,_std::pair<int,_int>_> voxel;
  iterator __end1;
  iterator __begin1;
  set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
  *__range1;
  int i;
  double delta;
  double delta_intensity;
  int b;
  double delta_F;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  Volume *in_stack_fffffffffffffe70;
  Volume *local_c8;
  int local_c0;
  _Self local_b0;
  _Self local_a8;
  undefined8 local_a0;
  Matrix *local_98;
  int local_90;
  int local_8c;
  double local_88;
  pair<int,_int> local_80;
  _Self local_78;
  _Self local_70;
  long local_68;
  int local_5c;
  double local_58;
  double local_50;
  int local_44;
  double local_40;
  int local_34;
  vector<double,_std::allocator<double>_> *local_30;
  vector<double,_std::allocator<double>_> *local_28;
  vector<double,_std::allocator<double>_> *local_20;
  undefined8 local_10;
  
  local_40 = 0.0;
  local_5c = 0;
  local_68 = in_RDI + 0x78;
  local_34 = in_R9D;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RSI;
  local_70._M_node =
       (_Base_ptr)
       std::
       set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
       ::begin((set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_78._M_node =
       (_Base_ptr)
       std::
       set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
       ::end((set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  do {
    bVar1 = std::operator!=(&local_70,&local_78);
    if (!bVar1) {
      return local_40;
    }
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<double,_std::pair<int,_int>_>_>::operator*
                       ((_Rb_tree_const_iterator<std::pair<double,_std::pair<int,_int>_>_> *)
                        0x130d38);
    local_88 = ppVar2->first;
    local_80 = ppVar2->second;
    local_8c = local_80.first;
    local_90 = local_80.second;
    std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::operator[]
              (*(vector<imrt::Volume,_std::allocator<imrt::Volume>_> **)(in_RDI + 0x40),
               (long)local_80.first);
    local_98 = Volume::getDepositionMatrix(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    local_58 = 0.0;
    local_a0 = local_10;
    local_a8._M_node =
         (_List_node_base *)
         std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                   ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_b0._M_node =
         (_List_node_base *)
         std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::end
                   ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    while (bVar1 = std::operator!=(&local_a8,&local_b0), bVar1) {
      ppVar3 = std::_List_iterator<std::pair<int,_double>_>::operator*
                         ((_List_iterator<std::pair<int,_double>_> *)in_stack_fffffffffffffe70);
      dVar9 = local_58;
      local_50 = ppVar3->second;
      local_c0 = (int)*(undefined8 *)ppVar3;
      local_44 = local_c0;
      dVar8 = maths::Matrix::operator()(local_98,local_90,local_c0);
      local_58 = dVar8 * local_50 + dVar9;
      std::_List_iterator<std::pair<int,_double>_>::operator++(&local_a8);
    }
    if ((local_58 != 0.0) || (NAN(local_58))) {
      local_c8 = (Volume *)0x0;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x10),(long)local_8c);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_90);
      dVar9 = *pvVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_8c);
      if (*pvVar6 <= dVar9) {
LAB_0013106a:
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x10),(long)local_8c);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_90);
        dVar9 = *pvVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_8c);
        if (*pvVar6 <= dVar9) {
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)(in_RDI + 0x10),(long)local_8c);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_90);
          dVar9 = *pvVar5 + local_58;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_8c)
          ;
          if (dVar9 < *pvVar6) {
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_20,(long)local_8c);
            dVar9 = *pvVar6;
            std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_8c);
            pvVar4 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)(in_RDI + 0x10),(long)local_8c);
            std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_90);
            _Var11 = std::pow<double,int>
                               ((double)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
            local_c8 = (Volume *)(dVar9 * _Var11 + 0.0);
          }
        }
        else {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_8c)
          ;
          dVar9 = *pvVar6;
          std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_8c);
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)(in_RDI + 0x10),(long)local_8c);
          std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_90);
          _Var11 = std::pow<double,int>((double)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c)
          ;
          local_c8 = (Volume *)(-dVar9 * _Var11 + 0.0);
        }
      }
      else {
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x10),(long)local_8c);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_90);
        dVar9 = *pvVar5 + local_58;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_8c);
        if (*pvVar6 <= dVar9) goto LAB_0013106a;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_8c);
        dVar8 = local_58;
        dVar10 = *pvVar6 * local_58;
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x10),(long)local_8c);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_90);
        dVar9 = *pvVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_8c);
        local_c8 = (Volume *)(dVar10 * ((dVar9 - *pvVar6) + (dVar9 - *pvVar6) + dVar8) + 0.0);
      }
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x10),(long)local_8c);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_90);
      dVar9 = *pvVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_8c);
      if (dVar9 < *pvVar6 || dVar9 == *pvVar6) {
LAB_00131432:
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x10),(long)local_8c);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_90);
        dVar9 = *pvVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_8c);
        if (dVar9 < *pvVar6 || dVar9 == *pvVar6) {
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)(in_RDI + 0x10),(long)local_8c);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_90);
          dVar9 = *pvVar5 + local_58;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_8c)
          ;
          if (*pvVar6 <= dVar9 && dVar9 != *pvVar6) {
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_20,(long)local_8c);
            dVar9 = *pvVar6;
            pvVar4 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)(in_RDI + 0x10),(long)local_8c);
            std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_90);
            std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_8c);
            _Var11 = std::pow<double,int>
                               ((double)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
            local_c8 = (Volume *)(dVar9 * _Var11 + (double)local_c8);
          }
        }
        else {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_8c)
          ;
          dVar9 = *pvVar6;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)(in_RDI + 0x10),(long)local_8c);
          std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_90);
          std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_8c);
          _Var11 = std::pow<double,int>((double)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c)
          ;
          local_c8 = (Volume *)(-dVar9 * _Var11 + (double)local_c8);
        }
      }
      else {
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x10),(long)local_8c);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_90);
        dVar9 = *pvVar5 + local_58;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_8c);
        if (dVar9 < *pvVar6 || dVar9 == *pvVar6) goto LAB_00131432;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_8c);
        dVar8 = local_58;
        dVar10 = *pvVar6 * local_58;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_8c);
        dVar9 = *pvVar6;
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x10),(long)local_8c);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_90);
        local_c8 = (Volume *)
                   (dVar10 * (-dVar9 + *pvVar5 + -dVar9 + *pvVar5 + dVar8) + (double)local_c8);
      }
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)local_8c);
      local_40 = (double)local_c8 / (double)*pvVar7 + local_40;
      local_5c = local_5c + 1;
      in_stack_fffffffffffffe70 = local_c8;
      if (local_34 < local_5c) {
        return local_40;
      }
    }
    std::_Rb_tree_const_iterator<std::pair<double,_std::pair<int,_int>_>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<double,_std::pair<int,_int>_>_> *)
               in_stack_fffffffffffffe70);
  } while( true );
}

Assistant:

double EvaluationFunction::get_delta_eval(list< pair< int, double > >& diff, double angle,
                                          vector<double>& w, vector<double>& Zmin, 
                                          vector<double>& Zmax,int n_voxels) const{
  
  double delta_F=0.0;
  int b;
  double delta_intensity, delta;
  
  int i=0;
  for(auto voxel:voxels){
    int o=voxel.second.first;
    int k=voxel.second.second;
    const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
    
    delta = 0;
    for (auto let:diff){
      b = let.first;
      delta_intensity = let.second;
      delta = delta + Dep(k,b)*(delta_intensity);
    }
    if(delta==0.0) continue;
    
    double pen=0.0;
    //with the change in the dose of a voxel we can incrementally modify the value of F
    if(Z[o][k] < Zmin[o] && Z[o][k] + delta < Zmin[o]) //update the penalty
      pen += w[o]*delta*(delta+2*(Z[o][k]-Zmin[o]));
    else if(Z[o][k] < Zmin[o]) //the penalty disappears
      pen -=  w[o] * ( pow(Zmin[o]-Z[o][k], 2) );
    else if(Z[o][k] + delta < Zmin[o]) //the penalty appears
      pen +=  w[o] * ( pow(Zmin[o]-(Z[o][k]+delta), 2) );
    
    if(Z[o][k] > Zmax[o] && Z[o][k] + delta > Zmax[o]) //update the penalty
      pen += w[o]*delta*(delta+2*(-Zmax[o] + Z[o][k]));
    else if(Z[o][k] > Zmax[o]) //the penalty disappears
      pen -=  w[o] * ( pow(Z[o][k]-Zmax[o], 2) );
    else if(Z[o][k] + delta > Zmax[o]) //the penalty appears
      pen +=  w[o] * ( pow(Z[o][k]+delta - Zmax[o], 2) );
    
    delta_F += pen/nb_voxels[o];
    i++; if(i>n_voxels) break;
  }
  return delta_F;
}